

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::construct_helper<std::__cxx11::string(*)(std::shared_ptr<std::istream>&)>::
_construct<std::__cxx11::string(&)(std::shared_ptr<std::istream>&),std::__cxx11::string,std::shared_ptr<std::istream>&>
          (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_ptr
           *val,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_ptr
                *target_function)

{
  cni_holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  *this;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_ptr
  *local_18;
  
  this = (cni_holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
          *)operator_new(0x28);
  local_18 = val;
  cni_holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  ::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}